

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceReleaseQueue.hpp
# Opt level: O3

void __thiscall
Diligent::ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::
DiscardResource<Diligent::DeviceContextVkImpl::DisposeVkCmdBuffer(Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,VkCommandBuffer_T*,unsigned_long)::CmdBufferRecycler,void>
          (ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this,
          CmdBufferRecycler *Resource,Uint64 FenceValue)

{
  VulkanCommandBufferPool *pVVar1;
  DynamicStaleResourceWrapper local_20;
  
  local_20.m_pStaleResource = (StaleResourceBase *)operator_new(0x18);
  (local_20.m_pStaleResource)->_vptr_StaleResourceBase =
       (_func_int **)&PTR__SpecificStaleResource_0091c710;
  pVVar1 = Resource->Pool;
  local_20.m_pStaleResource[1]._vptr_StaleResourceBase = (_func_int **)Resource->vkCmdBuff;
  local_20.m_pStaleResource[2]._vptr_StaleResourceBase = (_func_int **)pVVar1;
  Resource->vkCmdBuff = (VkCommandBuffer)0x0;
  Resource->Pool = (VulkanCommandBufferPool *)0x0;
  DiscardResource(this,&local_20,FenceValue);
  if (local_20.m_pStaleResource != (StaleResourceBase *)0x0) {
    (*(local_20.m_pStaleResource)->_vptr_StaleResourceBase[2])();
  }
  return;
}

Assistant:

void DiscardResource(ResourceType&& Resource, Uint64 FenceValue)
    {
        DiscardResource(CreateWrapper(std::move(Resource), 1), FenceValue);
    }